

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5Dequote(char *z)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  char cVar5;
  
  cVar3 = ']';
  if (*z != '[') {
    cVar3 = *z;
  }
  uVar1 = 1;
  uVar2 = 0;
  while( true ) {
    iVar4 = (int)uVar1;
    cVar5 = z[iVar4];
    if (cVar5 == '\0') break;
    uVar1 = (long)iVar4 + 1;
    if (cVar5 == cVar3) {
      if (z[uVar1] != cVar3) break;
      uVar1 = (ulong)(iVar4 + 2);
      cVar5 = cVar3;
    }
    z[uVar2] = cVar5;
    uVar2 = uVar2 + 1;
    uVar1 = uVar1 & 0xffffffff;
  }
  z[uVar2 & 0xffffffff] = '\0';
  return (int)uVar1;
}

Assistant:

static int fts5Dequote(char *z){
  char q;
  int iIn = 1;
  int iOut = 0;
  q = z[0];

  /* Set stack variable q to the close-quote character */
  assert( q=='[' || q=='\'' || q=='"' || q=='`' );
  if( q=='[' ) q = ']';  

  while( ALWAYS(z[iIn]) ){
    if( z[iIn]==q ){
      if( z[iIn+1]!=q ){
        /* Character iIn was the close quote. */
        iIn++;
        break;
      }else{
        /* Character iIn and iIn+1 form an escaped quote character. Skip
        ** the input cursor past both and copy a single quote character 
        ** to the output buffer. */
        iIn += 2;
        z[iOut++] = q;
      }
    }else{
      z[iOut++] = z[iIn++];
    }
  }

  z[iOut] = '\0';
  return iIn;
}